

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

int Fraig_MarkTfi2_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = pNode->TravId;
  iVar2 = pMan->nTravIds;
  iVar4 = 0;
  if (iVar1 != iVar2) {
    iVar4 = 0;
    do {
      pNode->TravId = iVar2;
      iVar3 = 1;
      if ((iVar1 == iVar2 + -1) || (-1 < pNode->NumPi)) goto LAB_0065dd15;
      iVar1 = Fraig_MarkTfi2_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
      pNode = (Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe);
      iVar4 = iVar4 + iVar1;
      iVar1 = pNode->TravId;
      iVar2 = pMan->nTravIds;
    } while (iVar1 != iVar2);
    iVar3 = 0;
LAB_0065dd15:
    iVar4 = iVar4 + iVar3;
  }
  return iVar4;
}

Assistant:

int Fraig_MarkTfi2_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 0;
    // skip the boundary node
    if ( pNode->TravId == pMan->nTravIds-1 )
    {
        pNode->TravId = pMan->nTravIds;
        return 1;
    }
    pNode->TravId = pMan->nTravIds;
    // skip the PI node
    if ( pNode->NumPi >= 0 )
        return 1;
    // check the children
    return Fraig_MarkTfi2_rec( pMan, Fraig_Regular(pNode->p1) ) +
           Fraig_MarkTfi2_rec( pMan, Fraig_Regular(pNode->p2) );
}